

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile_impl.h
# Opt level: O1

void __thiscall HG::ProfileImpl::~ProfileImpl(ProfileImpl *this)

{
  pointer pcVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dtor: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name).data._M_dataplus._M_p,
                      (this->name).data._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," @",2);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 7),1);
  pcVar1 = (this->name).data._M_dataplus._M_p;
  paVar3 = &(this->name).data.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ProfileImpl::~ProfileImpl() { std::cout << "dtor: " << name.data << " @" << this << '\n'; }